

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O3

Attribute *
Imf_3_4::
TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
makeNewAttribute(void)

{
  Attribute *this;
  
  this = (Attribute *)operator_new(0x28);
  this->_vptr_Attribute = (_func_int **)0x0;
  this[1]._vptr_Attribute = (_func_int **)0x0;
  this[2]._vptr_Attribute = (_func_int **)0x0;
  this[3]._vptr_Attribute = (_func_int **)0x0;
  this[4]._vptr_Attribute = (_func_int **)0x0;
  Attribute::Attribute(this);
  this->_vptr_Attribute = (_func_int **)&PTR__TypedAttribute_001e4298;
  this[1]._vptr_Attribute = (_func_int **)(this + 3);
  this[2]._vptr_Attribute = (_func_int **)0x0;
  *(undefined1 *)&this[3]._vptr_Attribute = 0;
  return this;
}

Assistant:

Attribute*
TypedAttribute<T>::makeNewAttribute ()
{
    return new TypedAttribute<T> ();
}